

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O3

void __thiscall duckdb::TopNHeap::Reduce(TopNHeap *this)

{
  Allocator *allocator;
  pointer pTVar1;
  ulong uVar2;
  idx_t count_p;
  pointer pTVar3;
  pointer pTVar4;
  long lVar5;
  ulong uVar6;
  string_t sVar7;
  SelectionVector new_payload_sel;
  DataChunk new_heap_data;
  StringHeap new_sort_heap;
  SelectionVector local_d0;
  DataChunk local_b8;
  ArenaAllocator local_78;
  
  uVar6 = this->heap_size * 2;
  uVar2 = 0x2800;
  if (0x2800 < uVar6) {
    uVar2 = uVar6;
  }
  if (uVar2 <= (this->heap_data).count) {
    allocator = Allocator::DefaultAllocator();
    StringHeap::StringHeap((StringHeap *)&local_78,allocator);
    DataChunk::DataChunk(&local_b8);
    DataChunk::Initialize
              (&local_b8,this->allocator,this->payload_types,
               ((long)(this->heap).
                      super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                      super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->heap).
                      super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                      super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    SelectionVector::SelectionVector
              (&local_d0,
               ((long)(this->heap).
                      super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                      super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->heap).
                      super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                      super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    pTVar3 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
             super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
             super__Vector_impl_data._M_start;
    pTVar1 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
             super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pTVar1 == pTVar3) {
      count_p = 0;
    }
    else {
      lVar5 = 0;
      uVar6 = 0;
      do {
        pTVar4 = pTVar3;
        if (0xc < *(uint *)((long)&(pTVar3->sort_key).value + lVar5)) {
          sVar7 = StringHeap::AddBlob((StringHeap *)&local_78,
                                      (string_t *)((long)&(pTVar3->sort_key).value + lVar5));
          *(long *)((long)&(pTVar3->sort_key).value + lVar5) = sVar7.value._0_8_;
          *(long *)((long)&(pTVar3->sort_key).value + lVar5 + 8) = sVar7.value._8_8_;
          pTVar4 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                   super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl
                   .super__Vector_impl_data._M_start;
          pTVar1 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                   super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl
                   .super__Vector_impl_data._M_finish;
        }
        local_d0.sel_vector[uVar6] = *(sel_t *)((long)&pTVar3->index + lVar5);
        *(ulong *)((long)&pTVar3->index + lVar5) = uVar6;
        uVar6 = uVar6 + 1;
        count_p = ((long)pTVar1 - (long)pTVar4 >> 3) * -0x5555555555555555;
        lVar5 = lVar5 + 0x18;
        pTVar3 = pTVar4;
      } while (uVar6 < count_p);
    }
    DataChunk::Slice(&local_b8,&this->heap_data,&local_d0,count_p,0);
    DataChunk::Flatten(&local_b8);
    StringHeap::Destroy(&this->sort_key_heap);
    StringHeap::Move(&this->sort_key_heap,(StringHeap *)&local_78);
    DataChunk::Reference(&this->heap_data,&local_b8);
    if (local_d0.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d0.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    DataChunk::~DataChunk(&local_b8);
    ArenaAllocator::~ArenaAllocator(&local_78);
  }
  return;
}

Assistant:

idx_t ReduceThreshold() const {
		return MaxValue<idx_t>(STANDARD_VECTOR_SIZE * 5ULL, 2ULL * heap_size);
	}